

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1interval.cc
# Opt level: O3

S1Interval __thiscall S1Interval::Union(S1Interval *this,S1Interval *y)

{
  double dVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  double dVar4;
  Vector2_d VVar5;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  double lo;
  double hi;
  undefined1 auVar9 [16];
  S1Interval local_28;
  S2LogMessage local_18;
  
  dVar1 = (y->bounds_).c_[0];
  hi = (y->bounds_).c_[1];
  if ((((dVar1 == 3.141592653589793) && (!NAN(dVar1))) && (hi == -3.141592653589793)) && (!NAN(hi)))
  {
LAB_0019c4e5:
    local_28.bounds_.c_[0] = (this->bounds_).c_[0];
    local_28.bounds_.c_[1] = (this->bounds_).c_[1];
    goto LAB_0019c5b1;
  }
  lo = (this->bounds_).c_[0];
  dVar4 = (this->bounds_).c_[1];
  if (lo <= dVar4) {
    if ((lo <= dVar1) && (dVar1 <= dVar4)) {
      if (lo <= hi) goto LAB_0019c72d;
LAB_0019c755:
      local_28.bounds_.c_[0] = lo;
      local_28.bounds_.c_[1] = hi;
      if (((3.141592653589793 < ABS(hi)) || (3.141592653589793 < ABS(lo))) ||
         ((((hi != 3.141592653589793 || (NAN(hi))) && ((lo == -3.141592653589793 && (!NAN(lo))))) ||
          ((hi == -3.141592653589793 && ((!NAN(hi) && ((lo != 3.141592653589793 || (NAN(lo))))))))))
         ) {
        S2LogMessage::S2LogMessage
                  (&local_18,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1interval.h"
                   ,0xe4,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_18.stream_,"Check failed: is_valid() ",0x19);
LAB_0019c7fe:
        abort();
      }
      goto LAB_0019c5b1;
    }
    bVar6 = true;
    if (lo <= hi) {
      if (hi <= dVar4) goto LAB_0019c5f9;
      bVar6 = false;
    }
  }
  else {
    if (((lo <= dVar1) || (dVar1 <= dVar4)) &&
       ((lo != 3.141592653589793 || (((NAN(lo) || (dVar4 != -3.141592653589793)) || (NAN(dVar4))))))
       ) {
      if (hi < lo) {
LAB_0019c72d:
        if (dVar4 < hi) goto LAB_0019c755;
      }
      bVar6 = Contains(this,y);
      if (!bVar6) {
        local_28.bounds_.c_[0] = -3.141592653589793;
        local_28.bounds_.c_[1] = 3.141592653589793;
        goto LAB_0019c5b1;
      }
      goto LAB_0019c4e5;
    }
    if (((hi >= lo) || (bVar6 = true, hi <= dVar4)) &&
       ((lo != 3.141592653589793 ||
        (((NAN(lo) || (dVar4 != -3.141592653589793)) || (bVar6 = hi < lo, NAN(dVar4))))))) {
LAB_0019c5f9:
      local_28.bounds_.c_[0] = dVar1;
      local_28.bounds_.c_[1] = dVar4;
      if (((3.141592653589793 < ABS(dVar1)) || (3.141592653589793 < ABS(dVar4))) ||
         ((dVar4 != 3.141592653589793 && dVar1 == -3.141592653589793 ||
          (dVar1 != 3.141592653589793 && dVar4 == -3.141592653589793)))) {
        S2LogMessage::S2LogMessage
                  (&local_18,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1interval.h"
                   ,0xe4,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_18.stream_,"Check failed: is_valid() ",0x19);
        goto LAB_0019c7fe;
      }
      goto LAB_0019c5b1;
    }
  }
  if (((lo != 3.141592653589793) || (NAN(lo))) || ((dVar4 != -3.141592653589793 || (NAN(dVar4))))) {
    if (dVar1 <= hi) {
      if ((lo < dVar1) || (hi < lo)) goto LAB_0019c6c3;
    }
    else if (((bool)(lo < dVar1 & bVar6)) ||
            ((((dVar1 == 3.141592653589793 && (!NAN(dVar1))) && (hi == -3.141592653589793)) &&
             (!NAN(hi))))) {
LAB_0019c6c3:
      uVar7 = -(ulong)(lo - hi < 0.0);
      uVar8 = -(ulong)(dVar1 - dVar4 < 0.0);
      uVar3 = (ulong)((dVar1 + 3.141592653589793) - (dVar4 + -3.141592653589793)) & uVar8;
      auVar9._0_8_ = ~uVar7 & (ulong)(lo - hi);
      auVar9._8_8_ = ~uVar8 & (ulong)(dVar1 - dVar4);
      auVar2._8_4_ = (int)uVar3;
      auVar2._0_8_ = (ulong)((lo + 3.141592653589793) - (hi + -3.141592653589793)) & uVar7;
      auVar2._12_4_ = (int)(uVar3 >> 0x20);
      if (SUB168(auVar9 | auVar2,0) < SUB168(auVar9 | auVar2,8)) {
        hi = dVar4;
        lo = dVar1;
      }
      S1Interval(&local_28,lo,hi,ARGS_CHECKED);
      goto LAB_0019c5b1;
    }
  }
  local_28.bounds_.c_[0] = (y->bounds_).c_[0];
  local_28.bounds_.c_[1] = (y->bounds_).c_[1];
LAB_0019c5b1:
  VVar5.c_[1] = local_28.bounds_.c_[1];
  VVar5.c_[0] = local_28.bounds_.c_[0];
  return (Vector2_d)(Vector2_d)VVar5.c_;
}

Assistant:

S1Interval S1Interval::Union(const S1Interval& y) const {
  // The y.is_full() case is handled correctly in all cases by the code
  // below, but can follow three separate code paths depending on whether
  // this interval is inverted, is non-inverted but contains Pi, or neither.

  if (y.is_empty()) return *this;
  if (FastContains(y.lo())) {
    if (FastContains(y.hi())) {
      // Either this interval contains y, or the union of the two
      // intervals is the Full() interval.
      if (Contains(y)) return *this;  // is_full() code path
      return Full();
    }
    return S1Interval(lo(), y.hi(), ARGS_CHECKED);
  }
  if (FastContains(y.hi())) return S1Interval(y.lo(), hi(), ARGS_CHECKED);

  // This interval contains neither endpoint of y.  This means that either y
  // contains all of this interval, or the two intervals are disjoint.
  if (is_empty() || y.FastContains(lo())) return y;

  // Check which pair of endpoints are closer together.
  double dlo = PositiveDistance(y.hi(), lo());
  double dhi = PositiveDistance(hi(), y.lo());
  if (dlo < dhi) {
    return S1Interval(y.lo(), hi(), ARGS_CHECKED);
  } else {
    return S1Interval(lo(), y.hi(), ARGS_CHECKED);
  }
}